

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_infer(bitstream *str,uint32_t *val,uint32_t ival)

{
  uint32_t ival_local;
  uint32_t *val_local;
  bitstream *str_local;
  
  if (str->dir == VS_ENCODE) {
    if (*val != ival) {
      fprintf(_stderr,"Wrong infered value: %d != %d\n",(ulong)*val,(ulong)ival);
      return 1;
    }
  }
  else {
    *val = ival;
  }
  return 0;
}

Assistant:

int vs_infer(struct bitstream *str, uint32_t *val, uint32_t ival) {
	if (str->dir == VS_ENCODE) {
		if (*val != ival) {
			fprintf (stderr, "Wrong infered value: %d != %d\n", *val, ival);
			return 1;
		}
	} else {
		*val = ival;
	}
	return 0;
}